

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Matrix * __thiscall Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *a)

{
  pointer pvVar1;
  long lVar2;
  pointer pvVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int k;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pvVar10;
  float fVar11;
  
  if (this->cols == a->rows) {
    Matrix(__return_storage_ptr__,this->rows,a->cols);
    uVar6 = (ulong)(uint)a->cols;
    if (a->cols < 1) {
      uVar6 = 0;
    }
    uVar5 = (ulong)(uint)this->rows;
    if (this->rows < 1) {
      uVar5 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      pvVar1 = (__return_storage_ptr__->m).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = this->cols;
      if (this->cols < 1) {
        uVar4 = 0;
      }
      for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
        lVar2 = *(long *)&pvVar1[uVar8].super__Vector_base<float,_std::allocator<float>_>._M_impl;
        *(undefined4 *)(lVar2 + uVar9 * 4) = 0;
        pvVar3 = (this->m).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar10 = (a->m).
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar11 = 0.0;
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          fVar11 = fVar11 + *(float *)(*(long *)&pvVar3[uVar8].
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl + uVar7 * 4) *
                            *(float *)(*(long *)&(pvVar10->
                                                 super__Vector_base<float,_std::allocator<float>_>).
                                                 _M_impl + uVar9 * 4);
          *(float *)(lVar2 + uVar9 * 4) = fVar11;
          pvVar10 = pvVar10 + 1;
        }
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("cols == a.rows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/geometry.cpp"
                ,0x2b,"Matrix Matrix::operator*(const Matrix &)");
}

Assistant:

Matrix Matrix::operator*(const Matrix &a) {
    assert(cols == a.rows);
    Matrix result(rows, a.cols);
    for (int i = 0; i < rows; i++) {
        for (int j = 0; j < a.cols; j++) {
            result.m[i][j] = 0.f;
            for (int k = 0; k < cols; k++) {
                result.m[i][j] += m[i][k] * a.m[k][j];
            }
        }
    }
    return result;
}